

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

void __thiscall
phmap::container_internal::
raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,std::shared_ptr<ThreadState>>,phmap::Hash<unsigned_long>,phmap::EqualTo<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<ThreadState>>>>
::
emplace_at<std::piecewise_construct_t_const&,std::tuple<unsigned_int&>,std::tuple<std::shared_ptr<ThreadState>&&>>
          (raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,std::shared_ptr<ThreadState>>,phmap::Hash<unsigned_long>,phmap::EqualTo<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<ThreadState>>>>
           *this,size_t i,piecewise_construct_t *args,tuple<unsigned_int_&> *args_1,
          tuple<std::shared_ptr<ThreadState>_&&> *args_2)

{
  undefined8 *puVar1;
  long lVar2;
  shared_ptr<ThreadState> *psVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  long lVar6;
  const_iterator cVar7;
  FindElement local_18;
  
  lVar2 = *(long *)(this + 8);
  lVar6 = i * 0x18;
  psVar3 = (args_2->super__Tuple_impl<0UL,_std::shared_ptr<ThreadState>_&&>).
           super__Head_base<0UL,_std::shared_ptr<ThreadState>_&&,_false>._M_head_impl;
  *(ulong *)(lVar2 + lVar6) =
       (ulong)*(args_1->super__Tuple_impl<0UL,_unsigned_int_&>).
               super__Head_base<0UL,_unsigned_int_&,_false>._M_head_impl;
  *(undefined8 *)(lVar2 + 0x10 + lVar6) = 0;
  peVar4 = (psVar3->super___shared_ptr<ThreadState,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var5 = (psVar3->super___shared_ptr<ThreadState,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (psVar3->super___shared_ptr<ThreadState,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  puVar1 = (undefined8 *)(lVar2 + 8 + lVar6);
  *puVar1 = peVar4;
  puVar1[1] = p_Var5;
  (psVar3->super___shared_ptr<ThreadState,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0
  ;
  local_18.s = (raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
                *)this;
  cVar7 = DecomposePair<phmap::container_internal::raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,std::shared_ptr<ThreadState>>,phmap::Hash<unsigned_long>,phmap::EqualTo<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<ThreadState>>>>::FindElement,std::pair<unsigned_long_const,std::shared_ptr<ThreadState>>&>
                    (&local_18,
                     (pair<const_unsigned_long,_std::shared_ptr<ThreadState>_> *)(lVar2 + lVar6));
  if (cVar7.inner_.ctrl_ == (ctrl_t *)(i + *(long *)this)) {
    return;
  }
  __assert_fail("PolicyTraits::apply(FindElement{*this}, *iterator_at(i)) == iterator_at(i) && \"constructed value does not match the lookup key\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/siemens[P]drace/vendor/greg7mdp/parallel-hashmap/parallel_hashmap/phmap.h"
                ,0x802,
                "void phmap::container_internal::raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned long, std::shared_ptr<ThreadState>>, phmap::Hash<uint64_t>, phmap::EqualTo<unsigned long>, std::allocator<std::pair<const unsigned long, std::shared_ptr<ThreadState>>>>::emplace_at(size_t, Args &&...) [Policy = phmap::container_internal::FlatHashMapPolicy<unsigned long, std::shared_ptr<ThreadState>>, Hash = phmap::Hash<uint64_t>, Eq = phmap::EqualTo<unsigned long>, Alloc = std::allocator<std::pair<const unsigned long, std::shared_ptr<ThreadState>>>, Args = <const std::piecewise_construct_t &, std::tuple<unsigned int &>, std::tuple<std::shared_ptr<ThreadState> &&>>]"
               );
}

Assistant:

void emplace_at(size_t i, Args&&... args) {
        PolicyTraits::construct(&alloc_ref(), slots_ + i,
                                std::forward<Args>(args)...);

        assert(PolicyTraits::apply(FindElement{*this}, *iterator_at(i)) ==
               iterator_at(i) &&
               "constructed value does not match the lookup key");
    }